

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Option::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Option *this,PatternList *left)

{
  bool bVar1;
  shared_ptr<docopt::LeafPattern> local_70;
  shared_ptr<docopt::Pattern> *local_60;
  shared_ptr<docopt::Pattern> *local_58;
  difference_type local_50;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_48;
  Option *local_40;
  shared_ptr<docopt::Pattern> *local_38;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  thematch;
  PatternList *left_local;
  Option *this_local;
  
  thematch._M_current = (shared_ptr<docopt::Pattern> *)left;
  local_30._M_current =
       (shared_ptr<docopt::Pattern> *)
       std::
       vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ::begin(left);
  local_38 = (shared_ptr<docopt::Pattern> *)
             std::
             vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)thematch._M_current);
  local_40 = this;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,docopt::Option::single_match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&)const::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                       (local_30,(__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                  )local_38,(anon_class_8_1_8991fb9c_for__M_pred)this);
  local_48._M_current =
       (shared_ptr<docopt::Pattern> *)
       std::
       vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)thematch._M_current);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_48);
  if (bVar1) {
    std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
    pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>,_true>(__return_storage_ptr__);
  }
  else {
    local_58 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)thematch._M_current);
    local_60 = local_28._M_current;
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                         ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                           )local_58,local_28);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator*(&local_28);
    std::dynamic_pointer_cast<docopt::LeafPattern,docopt::Pattern>
              ((shared_ptr<docopt::Pattern> *)&local_70);
    std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
    pair<long,_std::shared_ptr<docopt::LeafPattern>,_true>
              (__return_storage_ptr__,&local_50,&local_70);
    std::shared_ptr<docopt::LeafPattern>::~shared_ptr(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Option::single_match(PatternList const& left) const
	{
		auto thematch = find_if(left.begin(), left.end(), [this](std::shared_ptr<Pattern> const& a) {
			auto leaf = std::dynamic_pointer_cast<LeafPattern>(a);
			return leaf && this->name() == leaf->name();
		});
		if (thematch == left.end()) {
			return {};
		}
		return { std::distance(left.begin(), thematch), std::dynamic_pointer_cast<LeafPattern>(*thematch) };
	}